

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTPressureBMP180.cpp
# Opt level: O3

bool __thiscall RTPressureBMP180::pressureInit(RTPressureBMP180 *this)

{
  uchar slaveAddr;
  RTIMUSettings *this_00;
  bool bVar1;
  uchar result;
  uchar data [22];
  uchar local_29;
  undefined4 local_28;
  byte local_24;
  ushort local_22;
  ushort local_20;
  ushort local_1e;
  undefined4 local_1c;
  undefined4 local_18;
  uint local_14;
  
  this_00 = (this->super_RTPressure).m_settings;
  slaveAddr = this_00->m_I2CPressureAddress;
  this->m_pressureAddr = slaveAddr;
  bVar1 = RTIMUHal::HALRead(&this_00->super_RTIMUHal,slaveAddr,0xd0,'\x01',&local_29,
                            "Failed to read BMP180 id");
  if (bVar1) {
    if (local_29 != 'U') {
      fprintf(_stderr,"Incorrect BMP180 id %d\n");
      return false;
    }
    bVar1 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                              this->m_pressureAddr,0xaa,'\x16',(uchar *)&local_28,
                              "Failed to read BMP180 calibration data");
    if (bVar1) {
      this->m_AC1 = local_28 >> 8 & 0xff | (int)(short)(local_28 << 8);
      this->m_AC2 = local_28 >> 0x18 | (int)(short)((ushort)local_28._2_1_ << 8);
      this->m_AC3 = (int)(short)((ushort)local_24 << 8) | (uint)local_24;
      this->m_AC4 = (uint)(ushort)(local_22 << 8 | local_22 >> 8);
      this->m_AC5 = (uint)(ushort)(local_20 << 8 | local_20 >> 8);
      this->m_AC6 = (uint)(ushort)(local_1e << 8 | local_1e >> 8);
      this->m_B1 = local_1c >> 8 & 0xff | (int)(short)(local_1c << 8);
      this->m_B2 = local_1c >> 0x18 | (int)(short)((ushort)local_1c._2_1_ << 8);
      this->m_MB = local_18 >> 8 & 0xff | (int)(short)(local_18 << 8);
      this->m_MC = local_18 >> 0x18 | (int)(short)((ushort)local_18._2_1_ << 8);
      this->m_MD = local_14 >> 8 & 0xff | (int)(short)(local_14 << 8);
      this->m_state = 0;
      this->m_oss = 0;
      return true;
    }
  }
  return false;
}

Assistant:

bool RTPressureBMP180::pressureInit()
{
    unsigned char result;
    unsigned char data[22];

    m_pressureAddr = m_settings->m_I2CPressureAddress;

    // check ID of chip

    if (!m_settings->HALRead(m_pressureAddr, BMP180_REG_ID, 1, &result, "Failed to read BMP180 id"))
        return false;

    if (result != BMP180_ID) {
        HAL_ERROR1("Incorrect BMP180 id %d\n", result);
        return false;
    }

    // get calibration data

    if (!m_settings->HALRead(m_pressureAddr, BMP180_REG_AC1, 22, data, "Failed to read BMP180 calibration data"))
        return false;

    m_AC1 = (int16_t)(((uint16_t)data[0]) << 8) + (uint16_t)data[1];
    m_AC2 = (int16_t)(((uint16_t)data[2]) << 8) + (uint16_t)data[3];
    m_AC3 = (int16_t)(((uint16_t)data[4]) << 8) + (uint16_t)data[4];
    m_AC4 = (((uint16_t)data[6]) << 8) + (uint16_t)data[7];
    m_AC5 = (((uint16_t)data[8]) << 8) + (uint16_t)data[9];
    m_AC6 = (((uint16_t)data[10]) << 8) + (uint16_t)data[11];
    m_B1 = (int16_t)(((uint16_t)data[12]) << 8) + (uint16_t)data[13];
    m_B2 = (int16_t)(((uint16_t)data[14]) << 8) + (uint16_t)data[15];
    m_MB = (int16_t)(((uint16_t)data[16]) << 8) + (uint16_t)data[17];
    m_MC = (int16_t)(((uint16_t)data[18]) << 8) + (uint16_t)data[19];
    m_MD = (int16_t)(((uint16_t)data[20]) << 8) + (uint16_t)data[21];

    m_state = BMP180_STATE_IDLE;
    m_oss = BMP180_SCO_PRESSURECONV_ULP;
    return true;
}